

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

void __thiscall
TimerTest_detachedWithIterations_Test::TestBody(TimerTest_detachedWithIterations_Test *this)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  AssertionResult gtest_ar;
  promise<void> promise;
  size_t iterations;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __basic_future<void> local_68;
  future_status local_58;
  future_status local_54;
  promise<void> local_50;
  undefined8 *local_38;
  promise<void> *ppStack_30;
  code *local_28;
  code *pcStack_20;
  undefined8 local_18;
  
  local_18 = 0;
  std::promise<void>::promise(&local_50);
  pcStack_20 = std::
               _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:107:35)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:107:35)>
             ::_M_manager;
  local_38 = &local_18;
  ppStack_30 = &local_50;
  jessilib::timer::timer((timer *)local_78,1000000,4);
  jessilib::timer::detach();
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  std::__basic_future<void>::__basic_future(&local_68,&local_50._M_future);
  local_80.__r = 0x394c549ef0000;
  if (local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    local_54 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000000000l>>
                         (local_68._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&local_80);
    local_58 = ready;
    testing::internal::CmpHelperEQ<std::future_status,std::future_status>
              ((internal *)local_78,"promise.get_future().wait_for(timeout * 1000000)",
               "std::future_status::ready",&local_54,&local_58);
    if (local_68._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_pi ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pp_Var2 = (_func_int **)0x494e83;
      }
      else {
        pp_Var2 = (_func_int **)((_Alloc_hider *)&(local_70._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
                 ,0x72,(char *)pp_Var2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if (local_68._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (_State_baseV2 *)0x0) {
        (*(local_68._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr__State_baseV2[1])();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._M_pi);
    }
    std::promise<void>::~promise(&local_50);
    return;
  }
  uVar1 = std::__throw_future_error(3);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
  if (local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    (*(local_68._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr__State_baseV2[1])();
  }
  local_68._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_pi
                );
  }
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::promise<void>::~promise(&local_50);
  _Unwind_Resume(uVar1);
}

Assistant:

TEST(TimerTest, detachedWithIterations) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	{
		timer{period, total_iterations, [&iterations, &promise]([[maybe_unused]] timer& in_timer) {
			if (++iterations == total_iterations) {
				promise.set_value();
			}
		}}.detach();
	}

	EXPECT_EQ(promise.get_future().wait_for(timeout * 1000000), std::future_status::ready);
}